

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O1

long Curl_pp_state_timeout(pingpong *pp)

{
  connectdata *pcVar1;
  SessionHandle *pSVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  timeval tVar6;
  
  pcVar1 = pp->conn;
  pSVar2 = pcVar1->data;
  lVar5 = (pSVar2->set).server_response_timeout;
  if (lVar5 == 0) {
    lVar5 = pp->response_time;
  }
  tVar6 = curlx_tvnow();
  lVar3 = curlx_tvdiff(tVar6,pp->response);
  lVar5 = lVar5 - lVar3;
  lVar3 = (pSVar2->set).timeout;
  lVar4 = lVar5;
  if (lVar3 != 0) {
    tVar6 = curlx_tvnow();
    lVar4 = curlx_tvdiff(tVar6,pcVar1->now);
    lVar4 = lVar3 - lVar4;
    if (lVar5 < lVar4) {
      lVar4 = lVar5;
    }
  }
  return lVar4;
}

Assistant:

long Curl_pp_state_timeout(struct pingpong *pp)
{
  struct connectdata *conn = pp->conn;
  struct SessionHandle *data=conn->data;
  long timeout_ms; /* in milliseconds */
  long timeout2_ms; /* in milliseconds */
  long response_time= (data->set.server_response_timeout)?
    data->set.server_response_timeout: pp->response_time;

  /* if CURLOPT_SERVER_RESPONSE_TIMEOUT is set, use that to determine
     remaining time, or use pp->response because SERVER_RESPONSE_TIMEOUT is
     supposed to govern the response for any given server response, not for
     the time from connect to the given server response. */

  /* Without a requested timeout, we only wait 'response_time' seconds for the
     full response to arrive before we bail out */
  timeout_ms = response_time -
    Curl_tvdiff(Curl_tvnow(), pp->response); /* spent time */

  if(data->set.timeout) {
    /* if timeout is requested, find out how much remaining time we have */
    timeout2_ms = data->set.timeout - /* timeout time */
      Curl_tvdiff(Curl_tvnow(), conn->now); /* spent time */

    /* pick the lowest number */
    timeout_ms = CURLMIN(timeout_ms, timeout2_ms);
  }

  return timeout_ms;
}